

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff
          (RenderDeviceVkImpl *this,SoftwareQueueIndex CommandQueueId,VkCommandBuffer vkCmdBuff,
          CommandPoolWrapper *CmdPool)

{
  anon_class_16_2_98f91ee3 Action;
  bool bVar1;
  uint Value;
  Char *pCVar2;
  ICommandQueueVk *pIVar3;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_00;
  VulkanLogicalDevice *_LogicalDevice;
  pointer ppVar4;
  char (*in_R8) [2];
  TransientCmdPoolRecycler local_108;
  uchar local_d5;
  Uint32 local_d4;
  undefined1 local_d0 [8];
  string msg_2;
  _Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
  local_a8;
  iterator CmdPoolMgrIter;
  HardwareQueueIndex QueueFamilyIndex;
  Uint64 local_80;
  Uint64 FenceValue;
  string msg_1;
  VkResult err;
  undefined1 local_48 [8];
  string msg;
  CommandPoolWrapper *CmdPool_local;
  VkCommandBuffer vkCmdBuff_local;
  RenderDeviceVkImpl *this_local;
  SoftwareQueueIndex CommandQueueId_local;
  
  msg.field_2._8_8_ = CmdPool;
  CmdPool_local = (CommandPoolWrapper *)vkCmdBuff;
  vkCmdBuff_local = (VkCommandBuffer)this;
  this_local._7_1_ = CommandQueueId.m_Value;
  if (vkCmdBuff == (VkCommandBuffer)0x0) {
    FormatString<char[26],char[28]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"vkCmdBuff != VK_NULL_HANDLE",(char (*) [28])CmdPool);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ExecuteAndDisposeTransientCmdBuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x128);
    std::__cxx11::string::~string((string *)local_48);
  }
  msg_1.field_2._8_4_ = (*vkEndCommandBuffer)((VkCommandBuffer)CmdPool_local);
  if (msg_1.field_2._8_4_ != VK_SUCCESS) {
    FormatString<char[29]>((string *)&FenceValue,(char (*) [29])"Failed to end command buffer");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ExecuteAndDisposeTransientCmdBuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,299);
    std::__cxx11::string::~string((string *)&FenceValue);
  }
  local_80 = 0;
  Action.vkCmdBuff = (VkCommandBuffer *)&CmdPool_local;
  Action.FenceValue = &local_80;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
  ::
  LockCmdQueueAndRun<Diligent::RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff(Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,VkCommandBuffer_T*,VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T*,(VulkanUtilities::VulkanHandleTypeId)0>&&)::__0>
            ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
              *)this,this_local._7_1_,Action);
  CmdPoolMgrIter.
  super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
  ._M_cur._6_1_ = this_local._7_1_;
  pIVar3 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ::GetCommandQueue(&this->
                              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                             ,this_local._7_1_);
  Value = (*(pIVar3->super_ICommandQueue).super_IObject._vptr_IObject[0xc])();
  IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::
  IndexWrapper<unsigned_int,unsigned_int>
            ((IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag> *)
             ((long)&CmdPoolMgrIter.
                     super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                     ._M_cur + 7),Value);
  local_a8._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>_>
       ::find(&this->m_TransientCmdPoolMgrs,
              (key_type *)
              ((long)&CmdPoolMgrIter.
                      super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                      ._M_cur + 7));
  msg_2.field_2._8_8_ =
       std::
       unordered_map<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>_>
       ::end(&this->m_TransientCmdPoolMgrs);
  bVar1 = std::__detail::operator!=
                    (&local_a8,
                     (_Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                      *)((long)&msg_2.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_d4 = IndexWrapper::operator_cast_to_unsigned_int
                         ((IndexWrapper *)
                          ((long)&CmdPoolMgrIter.
                                  super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                                  ._M_cur + 7));
    FormatString<char[70],unsigned_int,char[2]>
              ((string *)local_d0,
               (Diligent *)"Unable to find transient command pool manager for queue family index ",
               (char (*) [70])&local_d4,(uint *)0xcca6b6,in_R8);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ExecuteAndDisposeTransientCmdBuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x185);
    std::__cxx11::string::~string((string *)local_d0);
  }
  local_d5 = this_local._7_1_;
  this_00 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ::GetReleaseQueue(&this->
                               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                              ,this_local._7_1_);
  _LogicalDevice = GetLogicalDevice(this);
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false,_false>
                         *)&local_a8);
  ExecuteAndDisposeTransientCmdBuff(Diligent::IndexWrapper<unsigned_char,Diligent::
  _SoftwareQueueIndexTag>,VkCommandBuffer_T*,VulkanUtilities::
  VulkanObjectWrapper<VkCommandPool_T*,(VulkanUtilities::VulkanHandleTypeId)0>&&)::
  TransientCmdPoolRecycler::TransientCmdPoolRecycler(VulkanUtilities::
  VulkanLogicalDevice_const&,Diligent::CommandPoolManager&,VulkanUtilities::
  VulkanObjectWrapper<VkCommandPool_T*,(VulkanUtilities::
  VulkanHandleTypeId_0>___VkCommandBuffer_T____
            (&local_108,_LogicalDevice,&ppVar4->second,(CommandPoolWrapper *)msg.field_2._8_8_,
             (VkCommandBuffer *)&CmdPool_local);
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::
  DiscardResource<Diligent::RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff(Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,VkCommandBuffer_T*,VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T*,(VulkanUtilities::VulkanHandleTypeId)0>&&)::TransientCmdPoolRecycler,void>
            (this_00,&local_108,local_80);
  ExecuteAndDisposeTransientCmdBuff::TransientCmdPoolRecycler::~TransientCmdPoolRecycler(&local_108)
  ;
  return;
}

Assistant:

void RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff(SoftwareQueueIndex                    CommandQueueId,
                                                           VkCommandBuffer                       vkCmdBuff,
                                                           VulkanUtilities::CommandPoolWrapper&& CmdPool)
{
    VERIFY_EXPR(vkCmdBuff != VK_NULL_HANDLE);

    VkResult err = vkEndCommandBuffer(vkCmdBuff);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to end command buffer");
    (void)err;

    // We MUST NOT discard stale objects when executing transient command buffer,
    // otherwise a resource can be destroyed while still being used by the GPU:
    //
    //
    // Next Cmd Buff| Next Fence |        Immediate Context               |            This thread               |
    //              |            |                                        |                                      |
    //      N       |     F      |                                        |                                      |
    //              |            |  Draw(ResourceX)                       |                                      |
    //      N  -  - | -   -   -  |  Release(ResourceX)                    |                                      |
    //              |            |  - {N, ResourceX} -> Stale Objects     |                                      |
    //              |            |                                        |                                      |
    //              |            |                                        | SubmitCommandBuffer()                |
    //              |            |                                        | - SubmittedCmdBuffNumber = N         |
    //              |            |                                        | - SubmittedFenceValue = F            |
    //     N+1      |    F+1     |                                        | - DiscardStaleVkObjects(N, F)        |
    //              |            |                                        |   - {F, ResourceX} -> Release Queue  |
    //              |            |                                        |                                      |
    //     N+2 -   -|  - F+2  -  |  ExecuteCommandBuffer()                |                                      |
    //              |            |  - SubmitCommandBuffer()               |                                      |
    //              |            |  - ResourceX is already in release     |                                      |
    //              |            |    queue with fence value F, and       |                                      |
    //              |            |    F < SubmittedFenceValue==F+1        |                                      |
    //
    // Since transient command buffers do not count as real command buffers, submit them directly to the queue
    // to avoid interference with the command buffer counter
    Uint64 FenceValue = 0;
    LockCmdQueueAndRun(CommandQueueId,
                       [&](ICommandQueueVk* pCmdQueueVk) //
                       {
                           FenceValue = pCmdQueueVk->SubmitCmdBuffer(vkCmdBuff);
                       } //
    );

    class TransientCmdPoolRecycler
    {
    public:
        TransientCmdPoolRecycler(const VulkanUtilities::VulkanLogicalDevice& _LogicalDevice,
                                 CommandPoolManager&                         _CmdPoolMgr,
                                 VulkanUtilities::CommandPoolWrapper&&       _Pool,
                                 VkCommandBuffer&&                           _vkCmdBuffer) :
            // clang-format off
            LogicalDevice{_LogicalDevice         },
            CmdPoolMgr   {&_CmdPoolMgr           },
            Pool         {std::move(_Pool)       },
            vkCmdBuffer  {std::move(_vkCmdBuffer)}
        // clang-format on
        {
            VERIFY_EXPR(Pool != VK_NULL_HANDLE && vkCmdBuffer != VK_NULL_HANDLE);
            _vkCmdBuffer = VK_NULL_HANDLE;
        }

        // clang-format off
        TransientCmdPoolRecycler             (const TransientCmdPoolRecycler&)  = delete;
        TransientCmdPoolRecycler& operator = (const TransientCmdPoolRecycler&)  = delete;
        TransientCmdPoolRecycler& operator = (      TransientCmdPoolRecycler&&) = delete;

        TransientCmdPoolRecycler(TransientCmdPoolRecycler&& rhs) noexcept :
            LogicalDevice{rhs.LogicalDevice         },
            CmdPoolMgr   {rhs.CmdPoolMgr            },
            Pool         {std::move(rhs.Pool)       },
            vkCmdBuffer  {std::move(rhs.vkCmdBuffer)}
        {
            rhs.CmdPoolMgr  = nullptr;
            rhs.vkCmdBuffer = VK_NULL_HANDLE;
        }
        // clang-format on

        ~TransientCmdPoolRecycler()
        {
            if (CmdPoolMgr != nullptr)
            {
                LogicalDevice.FreeCommandBuffer(Pool, vkCmdBuffer);
                CmdPoolMgr->RecycleCommandPool(std::move(Pool));
            }
        }

    private:
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice;

        CommandPoolManager*                 CmdPoolMgr = nullptr;
        VulkanUtilities::CommandPoolWrapper Pool;
        VkCommandBuffer                     vkCmdBuffer = VK_NULL_HANDLE;
    };

    HardwareQueueIndex QueueFamilyIndex{GetCommandQueue(CommandQueueId).GetQueueFamilyIndex()};
    auto               CmdPoolMgrIter = m_TransientCmdPoolMgrs.find(QueueFamilyIndex);
    VERIFY(CmdPoolMgrIter != m_TransientCmdPoolMgrs.end(),
           "Unable to find transient command pool manager for queue family index ", Uint32{QueueFamilyIndex}, ".");

    // Discard command pool directly to the release queue since we know exactly which queue it was submitted to
    // as well as the associated FenceValue
    // clang-format off
    GetReleaseQueue(CommandQueueId).DiscardResource(
        TransientCmdPoolRecycler
        {
            GetLogicalDevice(),
            CmdPoolMgrIter->second,
            std::move(CmdPool),
            std::move(vkCmdBuff)
        },
        FenceValue);
    // clang-format on
}